

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O3

ALLEGRO_BITMAP * al_clone_bitmap(ALLEGRO_BITMAP *bitmap)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int val;
  int val_00;
  ALLEGRO_BITMAP *bitmap_00;
  ALLEGRO_BITMAP *pAVar5;
  ALLEGRO_LOCKED_REGION *pAVar6;
  ALLEGRO_LOCKED_REGION *pAVar7;
  
  bitmap_00 = al_create_bitmap(bitmap->w,bitmap->h);
  if (bitmap_00 == (ALLEGRO_BITMAP *)0x0) {
    return (ALLEGRO_BITMAP *)0x0;
  }
  pAVar5 = bitmap->parent;
  if (bitmap->parent == (ALLEGRO_BITMAP *)0x0) {
    pAVar5 = bitmap;
  }
  iVar4 = pAVar5->_format;
  pAVar5 = bitmap_00->parent;
  if (bitmap_00->parent == (ALLEGRO_BITMAP *)0x0) {
    pAVar5 = bitmap_00;
  }
  iVar3 = pAVar5->_format;
  _Var1 = _al_pixel_format_is_compressed(iVar4);
  _Var2 = _al_pixel_format_is_compressed(iVar3);
  val = bitmap->w;
  val_00 = bitmap->h;
  if (((_Var1) && (_Var2)) && (iVar4 == iVar3)) {
    iVar3 = al_get_pixel_block_width(iVar4);
    iVar4 = al_get_pixel_block_height(iVar4);
    pAVar6 = al_lock_bitmap_blocked(bitmap,1);
    if (pAVar6 == (ALLEGRO_LOCKED_REGION *)0x0) goto LAB_00141e1c;
    pAVar7 = al_lock_bitmap_blocked(bitmap_00,2);
    if (pAVar7 != (ALLEGRO_LOCKED_REGION *)0x0) {
      val = _al_get_least_multiple(val,iVar3);
      val_00 = _al_get_least_multiple(val_00,iVar4);
      _Var1 = _al_trace_prefix("bitmap",0,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
                               ,0x2ae,"transfer_bitmap_data");
      if (_Var1) {
        _al_trace_suffix("Taking fast clone path.\n");
      }
LAB_00141dd7:
      _al_convert_bitmap_data
                (pAVar6->data,pAVar6->format,pAVar6->pitch,pAVar7->data,pAVar7->format,pAVar7->pitch
                 ,0,0,0,0,val,val_00);
      al_unlock_bitmap(bitmap);
      al_unlock_bitmap(bitmap_00);
      return bitmap_00;
    }
  }
  else {
    if (_Var2) {
      iVar3 = 0;
    }
    else {
      iVar4 = 0;
    }
    if (!_Var1) {
      iVar3 = iVar4;
    }
    pAVar6 = al_lock_bitmap(bitmap,iVar3,1);
    if (pAVar6 == (ALLEGRO_LOCKED_REGION *)0x0) goto LAB_00141e1c;
    pAVar7 = al_lock_bitmap(bitmap_00,iVar3,2);
    if (pAVar7 != (ALLEGRO_LOCKED_REGION *)0x0) goto LAB_00141dd7;
  }
  al_unlock_bitmap(bitmap);
LAB_00141e1c:
  al_destroy_bitmap((ALLEGRO_BITMAP *)0x141e24);
  return (ALLEGRO_BITMAP *)0x0;
}

Assistant:

ALLEGRO_BITMAP *al_clone_bitmap(ALLEGRO_BITMAP *bitmap)
{
   ALLEGRO_BITMAP *clone;
   ASSERT(bitmap);

   clone = al_create_bitmap(bitmap->w, bitmap->h);
   if (!clone)
      return NULL;
   if (!transfer_bitmap_data(bitmap, clone)) {
      al_destroy_bitmap(clone);
      return NULL;
   }
   return clone;
}